

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O3

int __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::number
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,DataKey *k)

{
  int iVar1;
  undefined8 *puVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  iVar1 = k->idx;
  if ((-1 < (long)iVar1) && (iVar1 < this->thesize)) {
    return this->theitem[iVar1].info;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid index","");
  *puVar2 = &PTR__SPxException_003adbd8;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_40,local_40 + local_38);
  __cxa_throw(puVar2,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const DataKey& k) const
   {
      if(k.idx < 0 || k.idx >= size())
         throw SPxException("Invalid index");

      return theitem[k.idx].info;
   }